

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffs.cpp
# Opt level: O3

int __thiscall libtorrent::aux::count_leading_zeros_sw(aux *this,span<const_unsigned_int> buf)

{
  ulong uVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  bool bVar7;
  
  uVar4 = (uint)buf.m_ptr;
  if (0 < (int)uVar4) {
    uVar3 = *(uint *)this;
    if (uVar3 == 0) {
      uVar5 = (ulong)(uVar4 & 0x7fffffff);
      iVar2 = 0x1f;
      uVar1 = 1;
      do {
        uVar6 = uVar1;
        if (uVar5 == uVar6) {
          if (uVar6 < uVar5) {
            return uVar4;
          }
          goto LAB_001b5d82;
        }
        uVar3 = *(uint *)(this + uVar6 * 4);
        iVar2 = iVar2 + 0x20;
        uVar1 = uVar6 + 1;
      } while (uVar3 == 0);
      bVar7 = uVar6 < uVar5;
    }
    else {
      bVar7 = true;
      iVar2 = 0x1f;
    }
    if (bVar7) {
      uVar4 = uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18;
      uVar4 = uVar4 >> 1 | uVar4;
      uVar4 = uVar4 >> 2 | uVar4;
      uVar4 = uVar4 >> 4 | uVar4;
      uVar4 = uVar4 >> 8 | uVar4;
      return iVar2 - log2p1::MultiplyDeBruijnBitPosition
                     [(uVar4 >> 0x10 | uVar4) * 0x7c4acdd >> 0x1b];
    }
  }
LAB_001b5d82:
  return uVar4 << 5;
}

Assistant:

int count_leading_zeros_sw(span<std::uint32_t const> buf)
	{
		auto const num = int(buf.size());
		std::uint32_t const* ptr = buf.data();

		TORRENT_ASSERT(num >= 0);
		TORRENT_ASSERT(ptr != nullptr);

		for (int i = 0; i < num; i++)
		{
			if (ptr[i] == 0) continue;
			return i * 32 + 31 - log2p1(aux::network_to_host(ptr[i]));
		}

		return num * 32;
	}